

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitRefTest(OptimizeInstructions *this,RefTest *curr)

{
  Module *pMVar1;
  Expression *pEVar2;
  EvaluationResult EVar3;
  Type b;
  Type TVar4;
  Type castType;
  Drop *pDVar5;
  Block *this_00;
  RefIsNull *this_01;
  Const *right;
  uint *puVar6;
  undefined8 uVar7;
  _Storage<wasm::Type,_true> extraout_RDX;
  _Storage<wasm::Type,_true> _Var8;
  bool bVar9;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  initializer_list<wasm::Expression_*> local_58;
  Drop *local_48;
  Const *local_40;
  Builder local_38;
  Builder builder;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)62>).super_Expression.type.id == 1) {
    return;
  }
  pMVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
  local_38.wasm = pMVar1;
  b = getFallthroughType(this,curr->ref);
  TVar4 = wasm::Type::getGreatestLowerBound((curr->castType).id,b);
  castType.id = (curr->castType).id;
  if ((TVar4.id != 1) && (bVar9 = TVar4.id != castType.id, castType = TVar4, bVar9)) {
    (curr->castType).id = TVar4.id;
  }
  EVar3 = GCTypeUtils::evaluateCastCheck(b,castType);
  puVar6 = &switchD_009d1bb7::switchdataD_00df819c;
  switch(EVar3) {
  case Success:
    pEVar2 = curr->ref;
    pDVar5 = (Drop *)MixedArena::allocSpace(&pMVar1->allocator,0x18,8);
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar5->value = pEVar2;
    Drop::finalize(pDVar5);
    local_48 = pDVar5;
    local_40 = Builder::makeConst<int>(&local_38,1);
    uVar7 = 0;
    _Var8 = extraout_RDX;
    goto LAB_009d1ca0;
  case Failure:
    pEVar2 = curr->ref;
    pDVar5 = (Drop *)MixedArena::allocSpace(&pMVar1->allocator,0x18,8);
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar5->value = pEVar2;
    Drop::finalize(pDVar5);
    right = Builder::makeConst<int>(&local_38,0);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)puVar6;
    this_00 = Builder::makeSequence(&local_38,(Expression *)pDVar5,(Expression *)right,type_00);
    break;
  case SuccessOnlyIfNull:
    pEVar2 = curr->ref;
    this_00 = (Block *)MixedArena::allocSpace(&pMVar1->allocator,0x18,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = RefIsNullId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (this_00->name).super_IString.str._M_len = (size_t)pEVar2;
    RefIsNull::finalize((RefIsNull *)this_00);
    break;
  case SuccessOnlyIfNonNull:
    pEVar2 = curr->ref;
    this_01 = (RefIsNull *)MixedArena::allocSpace(&pMVar1->allocator,0x18,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression._id = RefIsNullId
    ;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression.type.id = 0;
    this_01->value = pEVar2;
    RefIsNull::finalize(this_01);
    this_00 = (Block *)MixedArena::allocSpace(&pMVar1->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    *(undefined4 *)&(this_00->name).super_IString.str._M_len = 0x14;
    (this_00->name).super_IString.str._M_str = (char *)this_01;
    Unary::finalize((Unary *)this_00);
    break;
  case Unreachable:
    pEVar2 = curr->ref;
    pDVar5 = (Drop *)MixedArena::allocSpace(&pMVar1->allocator,0x18,8);
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar5->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar5->value = pEVar2;
    Drop::finalize(pDVar5);
    local_48 = pDVar5;
    local_40 = (Const *)MixedArena::allocSpace(&pMVar1->allocator,0x10,8);
    (local_40->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id =
         UnreachableId;
    (local_40->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 1;
    _Var8 = (_Storage<wasm::Type,_true>)0x2;
    uVar7 = 1;
LAB_009d1ca0:
    local_58._M_array = (iterator)&local_48;
    local_58._M_len = 2;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = uVar7;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = _Var8;
    this_00 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                        (&local_38,&local_58,type);
    break;
  default:
    goto switchD_009d1bb7_default;
  }
  replaceCurrent(this,(Expression *)this_00);
switchD_009d1bb7_default:
  return;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }